

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

char * __thiscall
google::protobuf::EnumOptions::_InternalParse(EnumOptions *this,char *ptr,ParseContext *ctx)

{
  uint uVar1;
  bool bVar2;
  uint64 uVar3;
  UninterpretedOption *msg;
  uint uVar4;
  UnknownFieldSet *unknown;
  char cVar5;
  ulong tag_00;
  uint local_4c;
  EnumOptions *pEStack_48;
  uint32 tag;
  InternalMetadata *local_40;
  char *local_38;
  
  local_40 = &(this->super_Message).super_MessageLite._internal_metadata_;
  uVar4 = 0;
  pEStack_48 = this;
  local_38 = ptr;
  do {
    while( true ) {
      bVar2 = internal::ParseContext::Done(ctx,&local_38);
      if (bVar2) goto LAB_002d3f27;
      local_38 = internal::ReadTag(local_38,&local_4c,0);
      if (local_38 == (char *)0x0) goto LAB_002d3f46;
      tag_00 = (ulong)local_4c;
      uVar1 = local_4c >> 3;
      cVar5 = (char)local_4c;
      if (uVar1 != 999) break;
      if (cVar5 == ':') {
        local_38 = local_38 + -2;
        do {
          local_38 = local_38 + 2;
          msg = RepeatedPtrField<google::protobuf::UninterpretedOption>::Add
                          (&this->uninterpreted_option_);
          local_38 = internal::ParseContext::ParseMessage<google::protobuf::UninterpretedOption>
                               (ctx,msg,local_38);
          if (local_38 == (char *)0x0) goto LAB_002d3f46;
        } while ((local_38 < (ctx->super_EpsCopyInputStream).limit_end_) &&
                (bVar2 = internal::ExpectTag<7994u>(local_38), bVar2));
      }
      else {
LAB_002d3e9f:
        if ((tag_00 == 0) || ((local_4c & 7) == 4)) {
          (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = local_4c - 1;
          goto LAB_002d3f27;
        }
        if (local_4c < 8000) {
          if (((ulong)local_40->ptr_ & 1) == 0) {
            unknown = internal::InternalMetadata::
                      mutable_unknown_fields_slow<google::protobuf::UnknownFieldSet>(local_40);
          }
          else {
            unknown = (UnknownFieldSet *)(((ulong)local_40->ptr_ & 0xfffffffffffffffe) + 8);
          }
          local_38 = internal::UnknownFieldParse(tag_00,unknown,local_38,ctx);
        }
        else {
          local_38 = internal::ExtensionSet::ParseField
                               (&this->_extensions_,tag_00,local_38,
                                (Message *)_EnumOptions_default_instance_,local_40,ctx);
        }
        if (local_38 == (char *)0x0) goto LAB_002d3f46;
      }
    }
    if (uVar1 == 3) {
      if (cVar5 == '\x18') {
        uVar4 = uVar4 | 2;
        uVar3 = internal::ReadVarint64(&local_38);
        pEStack_48->deprecated_ = uVar3 != 0;
        goto LAB_002d3e3e;
      }
      goto LAB_002d3e9f;
    }
    if ((uVar1 != 2) || (cVar5 != '\x10')) goto LAB_002d3e9f;
    uVar4 = uVar4 | 1;
    uVar3 = internal::ReadVarint64(&local_38);
    pEStack_48->allow_alias_ = uVar3 != 0;
LAB_002d3e3e:
  } while (local_38 != (char *)0x0);
LAB_002d3f46:
  local_38 = (char *)0x0;
LAB_002d3f27:
  (pEStack_48->_has_bits_).has_bits_[0] = (pEStack_48->_has_bits_).has_bits_[0] | uVar4;
  return local_38;
}

Assistant:

const char* EnumOptions::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  ::PROTOBUF_NAMESPACE_ID::Arena* arena = GetArena(); (void)arena;
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // optional bool allow_alias = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 16)) {
          _Internal::set_has_allow_alias(&has_bits);
          allow_alias_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional bool deprecated = 3 [default = false];
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 24)) {
          _Internal::set_has_deprecated(&has_bits);
          deprecated_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
      case 999:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 58)) {
          ptr -= 2;
          do {
            ptr += 2;
            ptr = ctx->ParseMessage(_internal_add_uninterpreted_option(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<7994>(ptr));
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
      if ((8000u <= tag)) {
        ptr = _extensions_.ParseField(tag, ptr,
            internal_default_instance(), &_internal_metadata_, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
        ptr = UnknownFieldParse(tag,
            _internal_metadata_.mutable_unknown_fields<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(),
            ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}